

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to16.h
# Opt level: O3

void ncnn::im2col_sgemm_pack4to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  uint uVar30;
  int *piVar31;
  long lVar32;
  undefined1 (*pauVar33) [64];
  int nn;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  _func_int ***ppp_Var38;
  void **ppvVar39;
  undefined1 (*pauVar40) [64];
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  undefined1 (*pauVar44) [16];
  long lVar45;
  int iVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  float zeros [16];
  undefined1 local_c8 [64];
  size_t local_88;
  Mat *local_80;
  void *local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar35 = (ulong)(int)uVar3;
  iVar34 = bottom_im2col->h;
  uVar43 = bottom_im2col->c;
  uVar4 = top_blob->c;
  local_88 = 0;
  local_c8._0_8_ = (Allocator *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8._24_4_ = 0;
  local_c8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  uVar30 = (uVar3 & 0xf) + (uVar3 >> 4);
  iVar46 = iVar34 << 4;
  if ((long)uVar35 < 0x10) {
    uVar30 = uVar3;
    iVar46 = iVar34;
  }
  local_c8._32_8_ = local_c8._0_8_;
  local_c8._40_4_ = local_c8._8_4_;
  local_c8._44_4_ = local_c8._12_4_;
  local_80 = _bias;
  Mat::create((Mat *)local_c8,iVar46,uVar43,uVar30,0x10,4,(Allocator *)opt);
  if (0 < (int)uVar3 >> 4) {
    lVar32 = 0x80;
    uVar37 = 0;
    do {
      if (0 < (int)uVar43) {
        ppp_Var38 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ + local_88 * uVar37 * local_c8._16_8_);
        uVar41 = 0;
        do {
          if (0 < iVar34) {
            pauVar44 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar41 + lVar32);
            iVar46 = iVar34;
            do {
              auVar48 = vunpcklps_avx512vl(pauVar44[-8],pauVar44[-7]);
              auVar49 = vunpcklps_avx512vl(pauVar44[-6],pauVar44[-5]);
              auVar5 = vunpckhps_avx(pauVar44[-8],pauVar44[-7]);
              auVar6 = vunpckhps_avx(pauVar44[-6],pauVar44[-5]);
              auVar9 = vmovlhps_avx512f(auVar48,auVar49);
              auVar50 = vunpckhpd_avx512vl(auVar48,auVar49);
              auVar10 = vmovlhps_avx512f(auVar5,auVar6);
              auVar49 = vunpckhpd_avx(auVar5,auVar6);
              auVar5 = vunpcklps_avx(pauVar44[-4],pauVar44[-3]);
              auVar51 = vunpcklps_avx512vl(pauVar44[-2],pauVar44[-1]);
              auVar6 = vunpckhps_avx(pauVar44[-4],pauVar44[-3]);
              auVar48 = vunpckhps_avx(pauVar44[-2],pauVar44[-1]);
              auVar11 = vmovlhps_avx512f(auVar5,auVar51);
              auVar52 = vunpckhpd_avx512vl(auVar5,auVar51);
              auVar5 = vmovlhps_avx(auVar6,auVar48);
              auVar51 = vunpckhpd_avx(auVar6,auVar48);
              auVar6 = vunpcklps_avx(*pauVar44,pauVar44[1]);
              auVar53 = vunpcklps_avx512vl(pauVar44[2],pauVar44[3]);
              auVar48 = vunpckhps_avx(*pauVar44,pauVar44[1]);
              auVar7 = vunpckhps_avx(pauVar44[2],pauVar44[3]);
              auVar12 = vmovlhps_avx512f(auVar6,auVar53);
              auVar54 = vunpckhpd_avx512vl(auVar6,auVar53);
              auVar6 = vmovlhps_avx(auVar48,auVar7);
              auVar7 = vunpckhpd_avx(auVar48,auVar7);
              auVar48 = vunpcklps_avx(pauVar44[4],pauVar44[5]);
              auVar55 = vunpcklps_avx512vl(pauVar44[6],pauVar44[7]);
              auVar53 = vunpckhps_avx(pauVar44[4],pauVar44[5]);
              auVar8 = vunpckhps_avx(pauVar44[6],pauVar44[7]);
              auVar13 = vmovlhps_avx512f(auVar48,auVar55);
              auVar55 = vunpckhpd_avx512vl(auVar48,auVar55);
              auVar48 = vmovlhps_avx(auVar53,auVar8);
              auVar53 = vunpckhpd_avx(auVar53,auVar8);
              *(undefined1 (*) [16])ppp_Var38 = auVar9;
              *(undefined1 (*) [16])(ppp_Var38 + 2) = auVar11;
              *(undefined1 (*) [16])(ppp_Var38 + 4) = auVar12;
              *(undefined1 (*) [16])(ppp_Var38 + 6) = auVar13;
              *(undefined1 (*) [16])(ppp_Var38 + 8) = auVar50;
              *(undefined1 (*) [16])(ppp_Var38 + 10) = auVar52;
              *(undefined1 (*) [16])(ppp_Var38 + 0xc) = auVar54;
              *(undefined1 (*) [16])(ppp_Var38 + 0xe) = auVar55;
              *(undefined1 (*) [16])(ppp_Var38 + 0x10) = auVar10;
              *(undefined1 (*) [16])(ppp_Var38 + 0x12) = auVar5;
              *(undefined1 (*) [16])(ppp_Var38 + 0x14) = auVar6;
              *(undefined1 (*) [16])(ppp_Var38 + 0x16) = auVar48;
              *(undefined1 (*) [16])(ppp_Var38 + 0x18) = auVar49;
              *(undefined1 (*) [16])(ppp_Var38 + 0x1a) = auVar51;
              *(undefined1 (*) [16])(ppp_Var38 + 0x1c) = auVar7;
              *(undefined1 (*) [16])(ppp_Var38 + 0x1e) = auVar53;
              ppp_Var38 = ppp_Var38 + 0x20;
              pauVar44 = (undefined1 (*) [16])(*pauVar44 + (long)(int)(uVar3 * 4) * 4);
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar43);
      }
      uVar37 = uVar37 + 1;
      lVar32 = lVar32 + 0x100;
    } while (uVar37 != (uint)((int)uVar3 >> 4));
  }
  uVar37 = uVar35 & 0xfffffffffffffff0;
  if ((uint)uVar37 != uVar3) {
    lVar32 = uVar37 << 4;
    do {
      if (0 < (int)uVar43) {
        uVar30 = (uint)uVar37;
        uVar36 = uVar30 + 0xf;
        if (-1 < (int)uVar30) {
          uVar36 = uVar30;
        }
        ppp_Var38 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ +
                    (long)(int)(((int)uVar36 >> 4) + (uVar30 - (uVar36 & 0xfffffff0))) * local_88 *
                    local_c8._16_8_);
        uVar41 = 0;
        do {
          if (0 < iVar34) {
            pauVar44 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar41 + lVar32);
            iVar46 = iVar34;
            do {
              *(undefined1 (*) [16])ppp_Var38 = *pauVar44;
              ppp_Var38 = ppp_Var38 + 2;
              pauVar44 = (undefined1 (*) [16])(*pauVar44 + (long)(int)(uVar3 * 4) * 4);
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar43);
      }
      uVar37 = uVar37 + 1;
      lVar32 = lVar32 + 0x10;
    } while ((long)uVar37 < (long)uVar35);
  }
  if (0 < (int)uVar4) {
    iVar34 = iVar34 * uVar43;
    uVar37 = 0;
    do {
      pauVar33 = (undefined1 (*) [64])
                 (top_blob->cstep * uVar37 * top_blob->elemsize + (long)top_blob->data);
      ppvVar39 = &local_80->data + uVar37 * 8;
      if (local_80 == (Mat *)0x0) {
        ppvVar39 = &local_78;
      }
      local_78 = (void *)0x0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 0x10) {
        uVar41 = 0;
      }
      else {
        lVar32 = 0;
        uVar42 = 0;
        do {
          auVar56 = *(undefined1 (*) [64])ppvVar39;
          auVar71 = auVar56;
          auVar70 = auVar56;
          auVar69 = auVar56;
          auVar68 = auVar56;
          auVar67 = auVar56;
          auVar66 = auVar56;
          auVar65 = auVar56;
          auVar64 = auVar56;
          auVar63 = auVar56;
          auVar62 = auVar56;
          auVar61 = auVar56;
          auVar60 = auVar56;
          auVar59 = auVar56;
          auVar58 = auVar56;
          auVar57 = auVar56;
          if (0 < iVar34 * 4) {
            lVar45 = local_88 * local_c8._16_8_ * lVar32;
            lVar47 = 0;
            iVar46 = iVar34 * 4;
            do {
              auVar2 = *(undefined1 (*) [64])
                        ((long)kernel->data + lVar47 + kernel->cstep * uVar37 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_c8._0_8_ + lVar47 + lVar45);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar56 = vfmadd231ps_avx512f(auVar56,auVar2,auVar14);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_c8._0_8_ + lVar47 + lVar45 + 4);
              auVar15._4_4_ = uVar1;
              auVar15._0_4_ = uVar1;
              auVar15._8_4_ = uVar1;
              auVar15._12_4_ = uVar1;
              auVar15._16_4_ = uVar1;
              auVar15._20_4_ = uVar1;
              auVar15._24_4_ = uVar1;
              auVar15._28_4_ = uVar1;
              auVar15._32_4_ = uVar1;
              auVar15._36_4_ = uVar1;
              auVar15._40_4_ = uVar1;
              auVar15._44_4_ = uVar1;
              auVar15._48_4_ = uVar1;
              auVar15._52_4_ = uVar1;
              auVar15._56_4_ = uVar1;
              auVar15._60_4_ = uVar1;
              auVar57 = vfmadd231ps_avx512f(auVar57,auVar2,auVar15);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar16._4_4_ = uVar1;
              auVar16._0_4_ = uVar1;
              auVar16._8_4_ = uVar1;
              auVar16._12_4_ = uVar1;
              auVar16._16_4_ = uVar1;
              auVar16._20_4_ = uVar1;
              auVar16._24_4_ = uVar1;
              auVar16._28_4_ = uVar1;
              auVar16._32_4_ = uVar1;
              auVar16._36_4_ = uVar1;
              auVar16._40_4_ = uVar1;
              auVar16._44_4_ = uVar1;
              auVar16._48_4_ = uVar1;
              auVar16._52_4_ = uVar1;
              auVar16._56_4_ = uVar1;
              auVar16._60_4_ = uVar1;
              auVar58 = vfmadd231ps_avx512f(auVar58,auVar2,auVar16);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar17._4_4_ = uVar1;
              auVar17._0_4_ = uVar1;
              auVar17._8_4_ = uVar1;
              auVar17._12_4_ = uVar1;
              auVar17._16_4_ = uVar1;
              auVar17._20_4_ = uVar1;
              auVar17._24_4_ = uVar1;
              auVar17._28_4_ = uVar1;
              auVar17._32_4_ = uVar1;
              auVar17._36_4_ = uVar1;
              auVar17._40_4_ = uVar1;
              auVar17._44_4_ = uVar1;
              auVar17._48_4_ = uVar1;
              auVar17._52_4_ = uVar1;
              auVar17._56_4_ = uVar1;
              auVar17._60_4_ = uVar1;
              auVar59 = vfmadd231ps_avx512f(auVar59,auVar2,auVar17);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar18._4_4_ = uVar1;
              auVar18._0_4_ = uVar1;
              auVar18._8_4_ = uVar1;
              auVar18._12_4_ = uVar1;
              auVar18._16_4_ = uVar1;
              auVar18._20_4_ = uVar1;
              auVar18._24_4_ = uVar1;
              auVar18._28_4_ = uVar1;
              auVar18._32_4_ = uVar1;
              auVar18._36_4_ = uVar1;
              auVar18._40_4_ = uVar1;
              auVar18._44_4_ = uVar1;
              auVar18._48_4_ = uVar1;
              auVar18._52_4_ = uVar1;
              auVar18._56_4_ = uVar1;
              auVar18._60_4_ = uVar1;
              auVar60 = vfmadd231ps_avx512f(auVar60,auVar2,auVar18);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar19._4_4_ = uVar1;
              auVar19._0_4_ = uVar1;
              auVar19._8_4_ = uVar1;
              auVar19._12_4_ = uVar1;
              auVar19._16_4_ = uVar1;
              auVar19._20_4_ = uVar1;
              auVar19._24_4_ = uVar1;
              auVar19._28_4_ = uVar1;
              auVar19._32_4_ = uVar1;
              auVar19._36_4_ = uVar1;
              auVar19._40_4_ = uVar1;
              auVar19._44_4_ = uVar1;
              auVar19._48_4_ = uVar1;
              auVar19._52_4_ = uVar1;
              auVar19._56_4_ = uVar1;
              auVar19._60_4_ = uVar1;
              auVar61 = vfmadd231ps_avx512f(auVar61,auVar2,auVar19);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar20._4_4_ = uVar1;
              auVar20._0_4_ = uVar1;
              auVar20._8_4_ = uVar1;
              auVar20._12_4_ = uVar1;
              auVar20._16_4_ = uVar1;
              auVar20._20_4_ = uVar1;
              auVar20._24_4_ = uVar1;
              auVar20._28_4_ = uVar1;
              auVar20._32_4_ = uVar1;
              auVar20._36_4_ = uVar1;
              auVar20._40_4_ = uVar1;
              auVar20._44_4_ = uVar1;
              auVar20._48_4_ = uVar1;
              auVar20._52_4_ = uVar1;
              auVar20._56_4_ = uVar1;
              auVar20._60_4_ = uVar1;
              auVar62 = vfmadd231ps_avx512f(auVar62,auVar2,auVar20);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar21._4_4_ = uVar1;
              auVar21._0_4_ = uVar1;
              auVar21._8_4_ = uVar1;
              auVar21._12_4_ = uVar1;
              auVar21._16_4_ = uVar1;
              auVar21._20_4_ = uVar1;
              auVar21._24_4_ = uVar1;
              auVar21._28_4_ = uVar1;
              auVar21._32_4_ = uVar1;
              auVar21._36_4_ = uVar1;
              auVar21._40_4_ = uVar1;
              auVar21._44_4_ = uVar1;
              auVar21._48_4_ = uVar1;
              auVar21._52_4_ = uVar1;
              auVar21._56_4_ = uVar1;
              auVar21._60_4_ = uVar1;
              auVar63 = vfmadd231ps_avx512f(auVar63,auVar2,auVar21);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x20))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar22._4_4_ = uVar1;
              auVar22._0_4_ = uVar1;
              auVar22._8_4_ = uVar1;
              auVar22._12_4_ = uVar1;
              auVar22._16_4_ = uVar1;
              auVar22._20_4_ = uVar1;
              auVar22._24_4_ = uVar1;
              auVar22._28_4_ = uVar1;
              auVar22._32_4_ = uVar1;
              auVar22._36_4_ = uVar1;
              auVar22._40_4_ = uVar1;
              auVar22._44_4_ = uVar1;
              auVar22._48_4_ = uVar1;
              auVar22._52_4_ = uVar1;
              auVar22._56_4_ = uVar1;
              auVar22._60_4_ = uVar1;
              auVar64 = vfmadd231ps_avx512f(auVar64,auVar2,auVar22);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x20))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar23._4_4_ = uVar1;
              auVar23._0_4_ = uVar1;
              auVar23._8_4_ = uVar1;
              auVar23._12_4_ = uVar1;
              auVar23._16_4_ = uVar1;
              auVar23._20_4_ = uVar1;
              auVar23._24_4_ = uVar1;
              auVar23._28_4_ = uVar1;
              auVar23._32_4_ = uVar1;
              auVar23._36_4_ = uVar1;
              auVar23._40_4_ = uVar1;
              auVar23._44_4_ = uVar1;
              auVar23._48_4_ = uVar1;
              auVar23._52_4_ = uVar1;
              auVar23._56_4_ = uVar1;
              auVar23._60_4_ = uVar1;
              auVar65 = vfmadd231ps_avx512f(auVar65,auVar2,auVar23);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x28))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar24._4_4_ = uVar1;
              auVar24._0_4_ = uVar1;
              auVar24._8_4_ = uVar1;
              auVar24._12_4_ = uVar1;
              auVar24._16_4_ = uVar1;
              auVar24._20_4_ = uVar1;
              auVar24._24_4_ = uVar1;
              auVar24._28_4_ = uVar1;
              auVar24._32_4_ = uVar1;
              auVar24._36_4_ = uVar1;
              auVar24._40_4_ = uVar1;
              auVar24._44_4_ = uVar1;
              auVar24._48_4_ = uVar1;
              auVar24._52_4_ = uVar1;
              auVar24._56_4_ = uVar1;
              auVar24._60_4_ = uVar1;
              auVar66 = vfmadd231ps_avx512f(auVar66,auVar2,auVar24);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x28))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25._16_4_ = uVar1;
              auVar25._20_4_ = uVar1;
              auVar25._24_4_ = uVar1;
              auVar25._28_4_ = uVar1;
              auVar25._32_4_ = uVar1;
              auVar25._36_4_ = uVar1;
              auVar25._40_4_ = uVar1;
              auVar25._44_4_ = uVar1;
              auVar25._48_4_ = uVar1;
              auVar25._52_4_ = uVar1;
              auVar25._56_4_ = uVar1;
              auVar25._60_4_ = uVar1;
              auVar67 = vfmadd231ps_avx512f(auVar67,auVar2,auVar25);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x30))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar26._32_4_ = uVar1;
              auVar26._36_4_ = uVar1;
              auVar26._40_4_ = uVar1;
              auVar26._44_4_ = uVar1;
              auVar26._48_4_ = uVar1;
              auVar26._52_4_ = uVar1;
              auVar26._56_4_ = uVar1;
              auVar26._60_4_ = uVar1;
              auVar68 = vfmadd231ps_avx512f(auVar68,auVar2,auVar26);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x30))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar27._4_4_ = uVar1;
              auVar27._0_4_ = uVar1;
              auVar27._8_4_ = uVar1;
              auVar27._12_4_ = uVar1;
              auVar27._16_4_ = uVar1;
              auVar27._20_4_ = uVar1;
              auVar27._24_4_ = uVar1;
              auVar27._28_4_ = uVar1;
              auVar27._32_4_ = uVar1;
              auVar27._36_4_ = uVar1;
              auVar27._40_4_ = uVar1;
              auVar27._44_4_ = uVar1;
              auVar27._48_4_ = uVar1;
              auVar27._52_4_ = uVar1;
              auVar27._56_4_ = uVar1;
              auVar27._60_4_ = uVar1;
              auVar69 = vfmadd231ps_avx512f(auVar69,auVar2,auVar27);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x38))->_vptr_Allocator +
                       lVar47 + lVar45);
              auVar28._4_4_ = uVar1;
              auVar28._0_4_ = uVar1;
              auVar28._8_4_ = uVar1;
              auVar28._12_4_ = uVar1;
              auVar28._16_4_ = uVar1;
              auVar28._20_4_ = uVar1;
              auVar28._24_4_ = uVar1;
              auVar28._28_4_ = uVar1;
              auVar28._32_4_ = uVar1;
              auVar28._36_4_ = uVar1;
              auVar28._40_4_ = uVar1;
              auVar28._44_4_ = uVar1;
              auVar28._48_4_ = uVar1;
              auVar28._52_4_ = uVar1;
              auVar28._56_4_ = uVar1;
              auVar28._60_4_ = uVar1;
              auVar70 = vfmadd231ps_avx512f(auVar70,auVar2,auVar28);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_c8._0_8_ + 0x38))->_vptr_Allocator +
                       lVar47 + lVar45 + 4);
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar29._16_4_ = uVar1;
              auVar29._20_4_ = uVar1;
              auVar29._24_4_ = uVar1;
              auVar29._28_4_ = uVar1;
              auVar29._32_4_ = uVar1;
              auVar29._36_4_ = uVar1;
              auVar29._40_4_ = uVar1;
              auVar29._44_4_ = uVar1;
              auVar29._48_4_ = uVar1;
              auVar29._52_4_ = uVar1;
              auVar29._56_4_ = uVar1;
              auVar29._60_4_ = uVar1;
              auVar71 = vfmadd231ps_avx512f(auVar71,auVar2,auVar29);
              lVar47 = lVar47 + 0x40;
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
          }
          *pauVar33 = auVar56;
          pauVar33[1] = auVar57;
          pauVar33[2] = auVar58;
          pauVar33[3] = auVar59;
          pauVar33[4] = auVar60;
          pauVar33[5] = auVar61;
          pauVar33[6] = auVar62;
          pauVar33[7] = auVar63;
          pauVar33[8] = auVar64;
          pauVar33[9] = auVar65;
          pauVar33[10] = auVar66;
          pauVar33[0xb] = auVar67;
          pauVar33[0xc] = auVar68;
          pauVar33[0xd] = auVar69;
          pauVar33[0xe] = auVar70;
          pauVar33[0xf] = auVar71;
          pauVar33 = pauVar33 + 0x10;
          uVar41 = uVar42 + 0x10;
          lVar45 = uVar42 + 0x1f;
          lVar32 = lVar32 + 1;
          uVar42 = uVar41;
        } while (lVar45 < (long)uVar35);
      }
      if ((int)uVar41 < (int)uVar3) {
        do {
          auVar56 = *(undefined1 (*) [64])ppvVar39;
          if (0 < iVar34 * 4) {
            pauVar40 = (undefined1 (*) [64])
                       (kernel->cstep * uVar37 * kernel->elemsize + (long)kernel->data);
            lVar32 = 0;
            do {
              auVar71 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)(_func_int ***)local_c8._0_8_ +
                                                    lVar32 * 4 +
                                                    local_88 * local_c8._16_8_ *
                                                    (ulong)(((uint)uVar41 & 0xf) +
                                                           ((uint)(uVar41 >> 4) & 0xfffffff)))));
              auVar56 = vfmadd231ps_avx512f(auVar56,auVar71,*pauVar40);
              pauVar40 = pauVar40 + 1;
              lVar32 = lVar32 + 1;
            } while (iVar34 * 4 != (int)lVar32);
          }
          *pauVar33 = auVar56;
          pauVar33 = pauVar33 + 1;
          uVar43 = (uint)uVar41 + 1;
          uVar41 = (ulong)uVar43;
        } while (uVar43 != uVar3);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != uVar4);
  }
  piVar31 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_c8._0_8_ != (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 16)
        tmp.create(16 * maxk, inch, size / 16 + size % 16, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 4;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 16;

            float* tmpptr = tmp.channel(i / 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x16
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);
                    __m128 _rc = _mm_load_ps(img0 + 4 * 12);
                    __m128 _rd = _mm_load_ps(img0 + 4 * 13);
                    __m128 _re = _mm_load_ps(img0 + 4 * 14);
                    __m128 _rf = _mm_load_ps(img0 + 4 * 15);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _rc);
                    _mm_store_ps(tmpptr + 4 * 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 5, _r5);
                    _mm_store_ps(tmpptr + 4 * 6, _r9);
                    _mm_store_ps(tmpptr + 4 * 7, _rd);
                    _mm_store_ps(tmpptr + 4 * 8, _r2);
                    _mm_store_ps(tmpptr + 4 * 9, _r6);
                    _mm_store_ps(tmpptr + 4 * 10, _ra);
                    _mm_store_ps(tmpptr + 4 * 11, _re);
                    _mm_store_ps(tmpptr + 4 * 12, _r3);
                    _mm_store_ps(tmpptr + 4 * 13, _r7);
                    _mm_store_ps(tmpptr + 4 * 14, _rb);
                    _mm_store_ps(tmpptr + 4 * 15, _rf);

                    img0 += size * 4;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 15 < size; i += 16)
        {
            float* tmpptr = tmp.channel(i / 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;
            __m512 _sum8 = _sum0;
            __m512 _sum9 = _sum0;
            __m512 _suma = _sum0;
            __m512 _sumb = _sum0;
            __m512 _sumc = _sum0;
            __m512 _sumd = _sum0;
            __m512 _sume = _sum0;
            __m512 _sumf = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);
                __m512 _val8 = _mm512_set1_ps(tmpptr[8]);
                __m512 _val9 = _mm512_set1_ps(tmpptr[9]);
                _sum8 = _mm512_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm512_fmadd_ps(_val9, _w0, _sum9);
                __m512 _vala = _mm512_set1_ps(tmpptr[10]);
                __m512 _valb = _mm512_set1_ps(tmpptr[11]);
                _suma = _mm512_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm512_fmadd_ps(_valb, _w0, _sumb);
                __m512 _valc = _mm512_set1_ps(tmpptr[12]);
                __m512 _vald = _mm512_set1_ps(tmpptr[13]);
                _sumc = _mm512_fmadd_ps(_valc, _w0, _sumc);
                _sumd = _mm512_fmadd_ps(_vald, _w0, _sumd);
                __m512 _vale = _mm512_set1_ps(tmpptr[14]);
                __m512 _valf = _mm512_set1_ps(tmpptr[15]);
                _sume = _mm512_fmadd_ps(_vale, _w0, _sume);
                _sumf = _mm512_fmadd_ps(_valf, _w0, _sumf);

                kptr += 16;
                tmpptr += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            _mm512_store_ps(outptr0 + 16 * 8, _sum8);
            _mm512_store_ps(outptr0 + 16 * 9, _sum9);
            _mm512_store_ps(outptr0 + 16 * 10, _suma);
            _mm512_store_ps(outptr0 + 16 * 11, _sumb);
            _mm512_store_ps(outptr0 + 16 * 12, _sumc);
            _mm512_store_ps(outptr0 + 16 * 13, _sumd);
            _mm512_store_ps(outptr0 + 16 * 14, _sume);
            _mm512_store_ps(outptr0 + 16 * 15, _sumf);

            outptr0 += 16 * 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}